

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O3

XML_Error addBinding(XML_Parser parser,PREFIX *prefix,ATTRIBUTE_ID *attId,XML_Char *uri,
                    BINDING **bindingsPtr)

{
  char *pcVar1;
  byte bVar2;
  byte bVar3;
  XML_Char *__dest;
  BINDING *pBVar4;
  BINDING *pBVar5;
  byte bVar6;
  XML_Error XVar7;
  ulong uVar8;
  bool bVar9;
  char cVar10;
  int iVar11;
  size_t __n;
  
  cVar10 = *uri;
  pcVar1 = prefix->name;
  if (cVar10 == '\0') {
    if (pcVar1 != (char *)0x0) {
      return XML_ERROR_UNDECLARING_PREFIX;
    }
    bVar6 = 0;
    bVar9 = true;
    XVar7 = XML_ERROR_RESERVED_NAMESPACE_URI;
    bVar3 = 1;
    uVar8 = 0;
    goto LAB_003fef57;
  }
  bVar3 = 1;
  XVar7 = XML_ERROR_RESERVED_NAMESPACE_URI;
  if ((((pcVar1 == (char *)0x0) || (*pcVar1 != 'x')) || (pcVar1[1] != 'm')) || (pcVar1[2] != 'l')) {
LAB_003feef5:
    bVar6 = 0;
    bVar2 = 1;
  }
  else {
    if (pcVar1[3] != '\0') {
      if (((pcVar1[3] == 'n') && (pcVar1[4] == 's')) && (pcVar1[5] == '\0')) {
        return XML_ERROR_RESERVED_PREFIX_XMLNS;
      }
      goto LAB_003feef5;
    }
    bVar6 = 1;
    XVar7 = XML_ERROR_RESERVED_PREFIX_XML;
    bVar2 = 0;
  }
  uVar8 = 0;
  bVar9 = true;
  do {
    if (((!bVar9) || (0x24 < uVar8)) || (cVar10 != "http://www.w3.org/XML/1998/namespace"[uVar8])) {
      bVar9 = false;
    }
    if (((bool)(bVar3 & bVar2)) &&
       ((0x1d < uVar8 || (cVar10 != "http://www.w3.org/2000/xmlns/"[uVar8])))) {
      bVar3 = 0;
    }
    cVar10 = uri[uVar8 + 1];
    uVar8 = uVar8 + 1;
  } while (cVar10 != '\0');
LAB_003fef57:
  if (bVar6 != ((int)uVar8 == 0x24 & bVar9)) {
    return XVar7;
  }
  if ((bool)(bVar3 & (int)uVar8 == 0x1d)) {
    return XML_ERROR_RESERVED_NAMESPACE_URI;
  }
  __n = ((uVar8 & 0xffffffff) + 1) - (ulong)(parser->m_namespaceSeparator == '\0');
  pBVar4 = parser->m_freeBindingList;
  iVar11 = (int)__n;
  if (pBVar4 == (BINDING *)0x0) {
    pBVar4 = (BINDING *)(*(parser->m_mem).malloc_fcn)(0x30);
    if (pBVar4 == (BINDING *)0x0) {
      return XML_ERROR_NO_MEMORY;
    }
    __dest = (XML_Char *)(*(parser->m_mem).malloc_fcn)((ulong)(iVar11 + 0x18U));
    pBVar4->uri = __dest;
    if (__dest == (XML_Char *)0x0) {
      (*(parser->m_mem).free_fcn)(pBVar4);
      return XML_ERROR_NO_MEMORY;
    }
    pBVar4->uriAlloc = iVar11 + 0x18U;
  }
  else {
    if (pBVar4->uriAlloc < iVar11) {
      __dest = (XML_Char *)(*(parser->m_mem).realloc_fcn)(pBVar4->uri,(ulong)(iVar11 + 0x18U));
      if (__dest == (XML_Char *)0x0) {
        return XML_ERROR_NO_MEMORY;
      }
      pBVar4->uri = __dest;
      pBVar4->uriAlloc = iVar11 + 0x18U;
    }
    else {
      __dest = pBVar4->uri;
    }
    parser->m_freeBindingList = pBVar4->nextTagBinding;
  }
  pBVar4->uriLen = iVar11;
  memcpy(__dest,uri,__n);
  if (parser->m_namespaceSeparator != '\0') {
    pBVar4->uri[__n - 1] = parser->m_namespaceSeparator;
  }
  pBVar4->prefix = prefix;
  pBVar4->attId = attId;
  pBVar4->prevPrefixBinding = prefix->binding;
  pBVar5 = pBVar4;
  if ((*uri == '\0') && (&parser->m_dtd->defaultPrefix == prefix)) {
    pBVar5 = (BINDING *)0x0;
  }
  prefix->binding = pBVar5;
  pBVar4->nextTagBinding = *bindingsPtr;
  *bindingsPtr = pBVar4;
  if ((attId != (ATTRIBUTE_ID *)0x0) &&
     (parser->m_startNamespaceDeclHandler != (XML_StartNamespaceDeclHandler)0x0)) {
    if (prefix->binding == (BINDING *)0x0) {
      uri = (XML_Char *)0x0;
    }
    (*parser->m_startNamespaceDeclHandler)(parser->m_handlerArg,prefix->name,uri);
  }
  return XML_ERROR_NONE;
}

Assistant:

static enum XML_Error
addBinding(XML_Parser parser, PREFIX *prefix, const ATTRIBUTE_ID *attId,
           const XML_Char *uri, BINDING **bindingsPtr)
{
  static const XML_Char xmlNamespace[] = {
    ASCII_h, ASCII_t, ASCII_t, ASCII_p, ASCII_COLON, ASCII_SLASH, ASCII_SLASH,
    ASCII_w, ASCII_w, ASCII_w, ASCII_PERIOD, ASCII_w, ASCII_3, ASCII_PERIOD,
    ASCII_o, ASCII_r, ASCII_g, ASCII_SLASH, ASCII_X, ASCII_M, ASCII_L,
    ASCII_SLASH, ASCII_1, ASCII_9, ASCII_9, ASCII_8, ASCII_SLASH,
    ASCII_n, ASCII_a, ASCII_m, ASCII_e, ASCII_s, ASCII_p, ASCII_a, ASCII_c,
    ASCII_e, '\0'
  };
  static const int xmlLen =
    (int)sizeof(xmlNamespace)/sizeof(XML_Char) - 1;
  static const XML_Char xmlnsNamespace[] = {
    ASCII_h, ASCII_t, ASCII_t, ASCII_p, ASCII_COLON, ASCII_SLASH, ASCII_SLASH,
    ASCII_w, ASCII_w, ASCII_w, ASCII_PERIOD, ASCII_w, ASCII_3, ASCII_PERIOD,
    ASCII_o, ASCII_r, ASCII_g, ASCII_SLASH, ASCII_2, ASCII_0, ASCII_0,
    ASCII_0, ASCII_SLASH, ASCII_x, ASCII_m, ASCII_l, ASCII_n, ASCII_s,
    ASCII_SLASH, '\0'
  };
  static const int xmlnsLen =
    (int)sizeof(xmlnsNamespace)/sizeof(XML_Char) - 1;

  XML_Bool mustBeXML = XML_FALSE;
  XML_Bool isXML = XML_TRUE;
  XML_Bool isXMLNS = XML_TRUE;

  BINDING *b;
  int len;

  /* empty URI is only valid for default namespace per XML NS 1.0 (not 1.1) */
  if (*uri == XML_T('\0') && prefix->name)
    return XML_ERROR_UNDECLARING_PREFIX;

  if (prefix->name
      && prefix->name[0] == XML_T(ASCII_x)
      && prefix->name[1] == XML_T(ASCII_m)
      && prefix->name[2] == XML_T(ASCII_l)) {

    /* Not allowed to bind xmlns */
    if (prefix->name[3] == XML_T(ASCII_n)
        && prefix->name[4] == XML_T(ASCII_s)
        && prefix->name[5] == XML_T('\0'))
      return XML_ERROR_RESERVED_PREFIX_XMLNS;

    if (prefix->name[3] == XML_T('\0'))
      mustBeXML = XML_TRUE;
  }

  for (len = 0; uri[len]; len++) {
    if (isXML && (len > xmlLen || uri[len] != xmlNamespace[len]))
      isXML = XML_FALSE;

    if (!mustBeXML && isXMLNS
        && (len > xmlnsLen || uri[len] != xmlnsNamespace[len]))
      isXMLNS = XML_FALSE;
  }
  isXML = isXML && len == xmlLen;
  isXMLNS = isXMLNS && len == xmlnsLen;

  if (mustBeXML != isXML)
    return mustBeXML ? XML_ERROR_RESERVED_PREFIX_XML
                     : XML_ERROR_RESERVED_NAMESPACE_URI;

  if (isXMLNS)
    return XML_ERROR_RESERVED_NAMESPACE_URI;

  if (parser->m_namespaceSeparator)
    len++;
  if (parser->m_freeBindingList) {
    b = parser->m_freeBindingList;
    if (len > b->uriAlloc) {
      XML_Char *temp = (XML_Char *)REALLOC(parser, b->uri,
                          sizeof(XML_Char) * (len + EXPAND_SPARE));
      if (temp == NULL)
        return XML_ERROR_NO_MEMORY;
      b->uri = temp;
      b->uriAlloc = len + EXPAND_SPARE;
    }
    parser->m_freeBindingList = b->nextTagBinding;
  }
  else {
    b = (BINDING *)MALLOC(parser, sizeof(BINDING));
    if (!b)
      return XML_ERROR_NO_MEMORY;
    b->uri = (XML_Char *)MALLOC(parser, sizeof(XML_Char) * (len + EXPAND_SPARE));
    if (!b->uri) {
      FREE(parser, b);
      return XML_ERROR_NO_MEMORY;
    }
    b->uriAlloc = len + EXPAND_SPARE;
  }
  b->uriLen = len;
  memcpy(b->uri, uri, len * sizeof(XML_Char));
  if (parser->m_namespaceSeparator)
    b->uri[len - 1] = parser->m_namespaceSeparator;
  b->prefix = prefix;
  b->attId = attId;
  b->prevPrefixBinding = prefix->binding;
  /* NULL binding when default namespace undeclared */
  if (*uri == XML_T('\0') && prefix == &parser->m_dtd->defaultPrefix)
    prefix->binding = NULL;
  else
    prefix->binding = b;
  b->nextTagBinding = *bindingsPtr;
  *bindingsPtr = b;
  /* if attId == NULL then we are not starting a namespace scope */
  if (attId && parser->m_startNamespaceDeclHandler)
    parser->m_startNamespaceDeclHandler(parser->m_handlerArg, prefix->name,
                              prefix->binding ? uri : 0);
  return XML_ERROR_NONE;
}